

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

Lexer * __thiscall Lexer::operator=(Lexer *this,Lexer *lexer)

{
  Lexer *lexer_local;
  Lexer *this_local;
  
  std::__cxx11::string::operator=((string *)&this->input_,(string *)&lexer->input_);
  this->index_ = lexer->index_;
  this->current_ = lexer->current_;
  LexerPosition::operator=(&this->position_,&lexer->position_);
  this->in_row_comment_ = (bool)(lexer->in_row_comment_ & 1);
  this->in_block_comment_ = (bool)(lexer->in_block_comment_ & 1);
  return this;
}

Assistant:

Lexer &Lexer::operator = (const Lexer &lexer) {
    input_ = lexer.input_;
    index_ = lexer.index_;
    current_ = lexer.current_;
    position_ = lexer.position_;
    in_row_comment_ = lexer.in_row_comment_;
    in_block_comment_ = lexer.in_block_comment_;
    return *this;
}